

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  byte *limit;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  FT_Fixed FVar4;
  byte bVar5;
  FT_Byte *cur_1;
  byte *pbVar6;
  FT_Int FVar7;
  byte *local_38;
  FT_Byte *cur;
  
  skip_spaces(&parser->cursor,parser->limit);
  limit = parser->limit;
  local_38 = parser->cursor;
  FVar7 = 0;
  if (local_38 < limit) {
    if (*local_38 == 0x5b) {
      bVar2 = false;
      bVar5 = 0x5d;
    }
    else if (*local_38 == 0x7b) {
      bVar5 = 0x7d;
      bVar2 = false;
    }
    else {
      bVar5 = 0;
      bVar2 = true;
    }
    if (!bVar2) {
      local_38 = local_38 + 1;
    }
    FVar7 = 0;
    do {
      if (limit <= local_38) break;
      do {
        uVar3 = (ulong)*local_38;
        pbVar6 = local_38;
        if (0x25 < uVar3) break;
        if ((0x100003601U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 != 0x25) break;
          do {
            pbVar6 = local_38;
            if ((*local_38 == 10) || (*local_38 == 0xd)) break;
            local_38 = local_38 + 1;
            pbVar6 = limit;
          } while (local_38 != limit);
        }
        local_38 = pbVar6 + 1;
        pbVar6 = local_38;
      } while (local_38 < limit);
      local_38 = pbVar6;
      if (pbVar6 < limit) {
        if (bVar5 == *pbVar6) {
          local_38 = pbVar6 + 1;
          goto LAB_00208dd9;
        }
        if ((coords != (FT_Short *)0x0) && (max_coords <= FVar7)) goto LAB_00208dd9;
        FVar4 = PS_Conv_ToFixed(&local_38,limit,0);
        if (coords != (FT_Short *)0x0) {
          coords[FVar7] = (FT_Short)((ulong)FVar4 >> 0x10);
        }
        FVar7 = FVar7 + 1;
        if (pbVar6 == local_38) {
          FVar7 = -1;
        }
        bVar1 = (bool)(pbVar6 != local_38 & (bVar2 ^ 1U));
      }
      else {
LAB_00208dd9:
        bVar1 = false;
      }
    } while (bVar1);
  }
  parser->cursor = local_38;
  return FVar7;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }